

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O1

void __thiscall
RenX::LadderDatabase::updateLadder(LadderDatabase *this,Server *server,TeamType *team)

{
  list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *plVar1;
  PlayerInfo *player;
  int *piVar2;
  long *plVar3;
  TeamType TVar4;
  size_t sVar5;
  Entry *pEVar6;
  int iVar7;
  size_t sVar8;
  Entry *__s;
  ulong uVar9;
  milliseconds mVar10;
  time_t tVar11;
  long lVar12;
  ostream *poVar13;
  size_t in_RCX;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  _List_node_base *p_Var18;
  undefined1 auVar19 [16];
  string_view msg;
  string str;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  string local_50;
  
  sVar5 = (server->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
          _M_impl._M_node._M_size;
  sVar8 = Server::getBotCount(server);
  if (sVar5 != sVar8) {
    plVar1 = &server->players;
    if (this->OnPreUpdateLadder != (PreUpdateLadderFunction *)0x0) {
      (*this->OnPreUpdateLadder)(this,server,team);
    }
    p_Var18 = (plVar1->super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>).
              _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var18 != (_List_node_base *)plVar1) {
      do {
        if ((p_Var18[0xf]._M_prev != (_List_node_base *)0x0) &&
           (((ulong)p_Var18[0x10]._M_next & 0x400000000) == 0)) {
          pEVar6 = this->m_head;
          for (__s = pEVar6;
              (__s != (Entry *)0x0 && ((_List_node_base *)__s->steam_id != p_Var18[0xf]._M_prev));
              __s = __s->next) {
          }
          if (__s == (Entry *)0x0) {
            __s = (Entry *)operator_new(0x140);
            memset(__s,0,0x140);
            (__s->most_recent_name)._M_dataplus._M_p = (pointer)&(__s->most_recent_name).field_2;
            (__s->most_recent_name)._M_string_length = 0;
            (__s->most_recent_name).field_2._M_local_buf[0] = '\0';
            __s->next = (Entry *)0x0;
            __s->prev = (Entry *)0x0;
            this->m_entries = this->m_entries + 1;
            if (pEVar6 == (Entry *)0x0) {
              this->m_head = __s;
            }
            else {
              pEVar6 = this->m_end;
              pEVar6->next = __s;
              __s->prev = pEVar6;
            }
            this->m_end = __s;
            __s->steam_id = (uint64_t)p_Var18[0xf]._M_prev;
          }
          player = (PlayerInfo *)(p_Var18 + 1);
          uVar9 = (ulong)(double)p_Var18[0x11]._M_prev;
          __s->total_score =
               __s->total_score +
               ((long)((double)p_Var18[0x11]._M_prev - 9.223372036854776e+18) & (long)uVar9 >> 0x3f
               | uVar9);
          __s->total_kills = __s->total_kills + *(int *)&p_Var18[0x13]._M_prev;
          __s->total_deaths = __s->total_deaths + *(int *)((long)&p_Var18[0x13]._M_prev + 4);
          __s->total_headshot_kills =
               __s->total_headshot_kills + *(int *)((long)&p_Var18[0x14]._M_next + 4);
          __s->total_vehicle_kills = __s->total_vehicle_kills + *(int *)&p_Var18[0x14]._M_prev;
          __s->total_building_kills =
               __s->total_building_kills + *(int *)((long)&p_Var18[0x14]._M_prev + 4);
          __s->total_defence_kills = __s->total_defence_kills + *(int *)&p_Var18[0x15]._M_next;
          __s->total_captures = __s->total_captures + *(int *)((long)&p_Var18[0x16]._M_prev + 4);
          mVar10 = Server::getGameTime(server,player);
          __s->total_game_time =
               __s->total_game_time +
               ((int)(SUB168(SEXT816(mVar10.__r) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
               (SUB164(SEXT816(mVar10.__r) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f));
          __s->total_beacon_placements =
               __s->total_beacon_placements + *(int *)((long)&p_Var18[0x15]._M_prev + 4);
          __s->total_beacon_disarms = __s->total_beacon_disarms + *(int *)&p_Var18[0x16]._M_next;
          __s->total_proxy_placements =
               __s->total_proxy_placements + *(int *)((long)&p_Var18[0x16]._M_next + 4);
          __s->total_proxy_disarms = __s->total_proxy_disarms + *(int *)&p_Var18[0x16]._M_prev;
          __s->total_games = __s->total_games + 1;
          TVar4 = *(TeamType *)&p_Var18[0x10]._M_prev;
          if (TVar4 == Nod) {
            __s->total_nod_games = __s->total_nod_games + 1;
            if (*team == Nod) {
              __s->total_wins = __s->total_wins + 1;
              __s->total_nod_wins = __s->total_nod_wins + 1;
            }
            else if (*team == None) {
              __s->total_nod_ties = __s->total_nod_ties + 1;
            }
            local_88 = 0xcc;
            local_90 = 200;
            local_98 = 0xc4;
            local_a0 = 0xc0;
            local_a8 = 0xbc;
            local_b0 = 0xb8;
            local_b8 = 0xb4;
            local_c0 = 0xb0;
            local_c8 = 0xac;
            lVar17 = 0xa8;
            lVar16 = 0x20;
            lVar15 = 0xa4;
LAB_0012744d:
            mVar10 = Server::getGameTime(server,player);
            piVar2 = (int *)((long)&__s->rank + lVar15);
            *piVar2 = *piVar2 + ((int)(SUB168(SEXT816(mVar10.__r) * SEXT816(0x20c49ba5e353f7cf),8)
                                      >> 7) -
                                (SUB164(SEXT816(mVar10.__r) * SEXT816(0x20c49ba5e353f7cf),0xc) >>
                                0x1f));
            uVar9 = (ulong)(double)p_Var18[0x11]._M_prev;
            plVar3 = (long *)((long)&__s->rank + lVar16);
            *plVar3 = *plVar3 + ((long)((double)p_Var18[0x11]._M_prev - 9.223372036854776e+18) &
                                 (long)uVar9 >> 0x3f | uVar9);
            piVar2 = (int *)((long)&__s->rank + lVar17);
            *piVar2 = *piVar2 + *(int *)((long)&p_Var18[0x15]._M_prev + 4);
            piVar2 = (int *)((long)&__s->rank + local_c8);
            *piVar2 = *piVar2 + *(int *)&p_Var18[0x16]._M_next;
            piVar2 = (int *)((long)&__s->rank + local_c0);
            *piVar2 = *piVar2 + *(int *)((long)&p_Var18[0x16]._M_next + 4);
            piVar2 = (int *)((long)&__s->rank + local_b8);
            *piVar2 = *piVar2 + *(int *)&p_Var18[0x16]._M_prev;
            piVar2 = (int *)((long)&__s->rank + local_b0);
            *piVar2 = *piVar2 + *(int *)&p_Var18[0x13]._M_prev;
            piVar2 = (int *)((long)&__s->rank + local_a8);
            *piVar2 = *piVar2 + *(int *)((long)&p_Var18[0x13]._M_prev + 4);
            piVar2 = (int *)((long)&__s->rank + local_a0);
            *piVar2 = *piVar2 + *(int *)&p_Var18[0x14]._M_prev;
            piVar2 = (int *)((long)&__s->rank + local_98);
            *piVar2 = *piVar2 + *(int *)&p_Var18[0x15]._M_next;
            piVar2 = (int *)((long)&__s->rank + local_90);
            *piVar2 = *piVar2 + *(int *)((long)&p_Var18[0x14]._M_prev + 4);
            iVar7 = *(int *)((long)&p_Var18[0x14]._M_next + 4);
LAB_00127544:
            piVar2 = (int *)((long)&__s->rank + local_88);
            *piVar2 = *piVar2 + iVar7;
          }
          else {
            if (TVar4 == GDI) {
              __s->total_gdi_games = __s->total_gdi_games + 1;
              if (*team == GDI) {
                __s->total_wins = __s->total_wins + 1;
                __s->total_gdi_wins = __s->total_gdi_wins + 1;
              }
              else if (*team == None) {
                __s->total_gdi_ties = __s->total_gdi_ties + 1;
              }
              local_88 = 0x94;
              local_90 = 0x90;
              local_98 = 0x8c;
              local_a0 = 0x88;
              local_a8 = 0x84;
              local_b0 = 0x80;
              local_b8 = 0x7c;
              local_c0 = 0x78;
              local_c8 = 0x74;
              lVar17 = 0x70;
              lVar16 = 0x18;
              lVar15 = 0x6c;
              goto LAB_0012744d;
            }
            if (TVar4 == *team) {
              iVar7 = 1;
              local_88 = 0x4c;
              goto LAB_00127544;
            }
          }
          uVar14 = (uint)(long)(double)p_Var18[0x11]._M_prev;
          if (__s->top_score < uVar14) {
            __s->top_score = uVar14;
          }
          if (__s->top_kills < *(uint *)&p_Var18[0x13]._M_prev) {
            __s->top_kills = *(uint *)&p_Var18[0x13]._M_prev;
          }
          uVar14 = *(uint *)((long)&p_Var18[0x13]._M_prev + 4);
          if (__s->most_deaths < uVar14) {
            __s->most_deaths = uVar14;
          }
          uVar14 = *(uint *)((long)&p_Var18[0x14]._M_next + 4);
          if (__s->top_headshot_kills < uVar14) {
            __s->top_headshot_kills = uVar14;
          }
          if (__s->top_vehicle_kills < *(uint *)&p_Var18[0x14]._M_prev) {
            __s->top_vehicle_kills = *(uint *)&p_Var18[0x14]._M_prev;
          }
          uVar14 = *(uint *)((long)&p_Var18[0x14]._M_prev + 4);
          if (__s->top_building_kills < uVar14) {
            __s->top_building_kills = uVar14;
          }
          if (__s->top_defence_kills < *(uint *)&p_Var18[0x15]._M_next) {
            __s->top_defence_kills = *(uint *)&p_Var18[0x15]._M_next;
          }
          uVar14 = *(uint *)((long)&p_Var18[0x16]._M_prev + 4);
          if (__s->top_captures < uVar14) {
            __s->top_captures = uVar14;
          }
          mVar10 = Server::getGameTime(server,player);
          in_RCX = 0x20c49ba5e353f7cf;
          uVar14 = (int)(SUB168(SEXT816(mVar10.__r) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
                   (SUB164(SEXT816(mVar10.__r) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f);
          if (__s->top_game_time < uVar14) {
            __s->top_game_time = uVar14;
          }
          uVar14 = *(uint *)((long)&p_Var18[0x15]._M_prev + 4);
          if (__s->top_beacon_placements < uVar14) {
            __s->top_beacon_placements = uVar14;
          }
          if (__s->top_beacon_disarms < *(uint *)&p_Var18[0x16]._M_next) {
            __s->top_beacon_disarms = *(uint *)&p_Var18[0x16]._M_next;
          }
          uVar14 = *(uint *)((long)&p_Var18[0x16]._M_next + 4);
          if (__s->top_proxy_placements < uVar14) {
            __s->top_proxy_placements = uVar14;
          }
          if (__s->top_proxy_disarms < *(uint *)&p_Var18[0x16]._M_prev) {
            __s->top_proxy_disarms = *(uint *)&p_Var18[0x16]._M_prev;
          }
          __s->most_recent_ip = *(uint32_t *)&p_Var18[0x10]._M_next;
          tVar11 = time((time_t *)0x0);
          __s->last_game = tVar11;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&__s->most_recent_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var18[1]._M_prev);
        }
        p_Var18 = p_Var18->_M_next;
      } while (p_Var18 != (_List_node_base *)plVar1);
    }
    lVar15 = std::chrono::_V2::steady_clock::now();
    sort_entries(this);
    lVar16 = std::chrono::_V2::steady_clock::now();
    lVar17 = std::chrono::_V2::steady_clock::now();
    auVar19 = Jupiter::Database::getFilename_abi_cxx11_();
    write(this,(int)*auVar19._0_8_,auVar19._8_8_,in_RCX);
    lVar12 = std::chrono::_V2::steady_clock::now();
    if (this->m_output_times != false) {
      string_printf_abi_cxx11_
                (&local_50,
                 "Ladder: %zu entries sorted in %f seconds; Database written in %f seconds.\r\n",
                 SUB84((double)(lVar16 - lVar15) * 1e-09,0),(double)(lVar12 - lVar17) * 1e-09,
                 this->m_entries);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length
                          );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      msg._M_str = local_50._M_dataplus._M_p;
      msg._M_len = local_50._M_string_length;
      Server::sendLogChan(server,msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void RenX::LadderDatabase::updateLadder(RenX::Server &server, const RenX::TeamType &team) {
	if (server.players.size() != server.getBotCount()) {
		// call the PreUpdateLadder event
		if (this->OnPreUpdateLadder != nullptr) {
			this->OnPreUpdateLadder(*this, server, team);
		}

		// update player stats in memory
		Entry *entry;
		for (auto player = server.players.begin(); player != server.players.end(); ++player) {
			if (player->steamid != 0 && (player->ban_flags & RenX::BanDatabase::Entry::FLAG_TYPE_LADDER) == 0) {
				entry = getPlayerEntry(player->steamid);
				if (entry == nullptr) {
					entry = new Entry();
					append(entry);
					entry->steam_id = player->steamid;
				}

				entry->total_score += static_cast<uint64_t>(player->score);

				entry->total_kills += player->kills;
				entry->total_deaths += player->deaths;
				entry->total_headshot_kills += player->headshots;
				entry->total_vehicle_kills += player->vehicleKills;
				entry->total_building_kills += player->buildingKills;
				entry->total_defence_kills += player->defenceKills;
				entry->total_captures += player->captures;
				entry->total_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
				entry->total_beacon_placements += player->beaconPlacements;
				entry->total_beacon_disarms += player->beaconDisarms;
				entry->total_proxy_placements += player->proxy_placements;
				entry->total_proxy_disarms += player->proxy_disarms;

				++entry->total_games;
				switch (player->team) {
				case RenX::TeamType::GDI:
					++entry->total_gdi_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_gdi_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_gdi_ties;

					entry->total_gdi_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_gdi_score += static_cast<uint64_t>(player->score);
					entry->total_gdi_beacon_placements += player->beaconPlacements;
					entry->total_gdi_beacon_disarms += player->beaconDisarms;
					entry->total_gdi_proxy_placements += player->proxy_placements;
					entry->total_gdi_proxy_disarms += player->proxy_disarms;
					entry->total_gdi_kills += player->kills;
					entry->total_gdi_deaths += player->deaths;
					entry->total_gdi_vehicle_kills += player->vehicleKills;
					entry->total_gdi_defence_kills += player->defenceKills;
					entry->total_gdi_building_kills += player->buildingKills;
					entry->total_gdi_headshots += player->headshots;
					break;
				case RenX::TeamType::Nod:
					++entry->total_nod_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_nod_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_nod_ties;

					entry->total_nod_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_nod_score += static_cast<uint64_t>(player->score);
					entry->total_nod_beacon_placements += player->beaconPlacements;
					entry->total_nod_beacon_disarms += player->beaconDisarms;
					entry->total_nod_proxy_placements += player->proxy_placements;
					entry->total_nod_proxy_disarms += player->proxy_disarms;
					entry->total_nod_kills += player->kills;
					entry->total_nod_deaths += player->deaths;
					entry->total_nod_vehicle_kills += player->vehicleKills;
					entry->total_nod_defence_kills += player->defenceKills;
					entry->total_nod_building_kills += player->buildingKills;
					entry->total_nod_headshots += player->headshots;
					break;
				default:
					if (player->team == team)
						++entry->total_wins;
					break;
				}

				auto set_if_greater = [](uint32_t &src, const uint32_t &cmp) {
					if (cmp > src) {
						src = cmp;
					}
				};

				set_if_greater(entry->top_score, static_cast<uint32_t>(player->score));
				set_if_greater(entry->top_kills, player->kills);
				set_if_greater(entry->most_deaths, player->deaths);
				set_if_greater(entry->top_headshot_kills, player->headshots);
				set_if_greater(entry->top_vehicle_kills, player->vehicleKills);
				set_if_greater(entry->top_building_kills, player->buildingKills);
				set_if_greater(entry->top_defence_kills, player->defenceKills);
				set_if_greater(entry->top_captures, player->captures);
				set_if_greater(entry->top_game_time, static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count()));
				set_if_greater(entry->top_beacon_placements, player->beaconPlacements);
				set_if_greater(entry->top_beacon_disarms, player->beaconDisarms);
				set_if_greater(entry->top_proxy_placements, player->proxy_placements);
				set_if_greater(entry->top_proxy_disarms, player->proxy_disarms);

				entry->most_recent_ip = player->ip32;
				entry->last_game = time(nullptr);
				entry->most_recent_name = player->name;
			}
		}

		// sort new stats
		std::chrono::steady_clock::time_point start_time = std::chrono::steady_clock::now();
		sort_entries();
		std::chrono::steady_clock::duration sort_duration = std::chrono::steady_clock::now() - start_time;

		// write new stats
		start_time = std::chrono::steady_clock::now();
		write(this->getFilename());
		std::chrono::steady_clock::duration write_duration = std::chrono::steady_clock::now() - start_time;

		if (m_output_times)
		{
			std::string str = string_printf("Ladder: %zu entries sorted in %f seconds; Database written in %f seconds." ENDL,
				getEntries(),
				static_cast<double>(sort_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)),
				static_cast<double>(write_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)));
			std::cout << str << std::endl;
			server.sendLogChan(str);
		}
	}
}